

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bn_div.c
# Opt level: O0

int bn_div_fixed_top(BIGNUM *dv,BIGNUM *rm,BIGNUM *num,BIGNUM *divisor,BN_CTX *ctx)

{
  uint uVar1;
  ulong *puVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  int iVar7;
  int iVar8;
  BIGNUM *pBVar9;
  BIGNUM *pBVar10;
  BIGNUM *a;
  BIGNUM *pBVar11;
  BIGNUM *pBVar12;
  BIGNUM *pBVar13;
  BIGNUM *pBVar14;
  ulong uVar15;
  ulong uVar16;
  BIGNUM *in_RCX;
  long in_RDX;
  long in_RSI;
  BIGNUM *in_RDI;
  BN_CTX *in_R8;
  uint128_t ret;
  unsigned_long t2h;
  unsigned_long t2l;
  unsigned_long n2;
  unsigned_long rem;
  unsigned_long n1;
  unsigned_long n0;
  unsigned_long l0;
  unsigned_long q;
  int num_neg;
  int div_n;
  int num_n;
  unsigned_long d1;
  unsigned_long d0;
  unsigned_long *wnumtop;
  unsigned_long *wnum;
  unsigned_long *resp;
  BIGNUM *res;
  BIGNUM *sdiv;
  BIGNUM *snum;
  BIGNUM *tmp;
  int loop;
  int j;
  int i;
  int norm_shift;
  undefined8 in_stack_fffffffffffffee8;
  int words;
  BIGNUM *in_stack_fffffffffffffef0;
  BIGNUM *a_00;
  BIGNUM *local_108;
  BIGNUM *local_f8;
  int in_stack_ffffffffffffff1c;
  BIGNUM *in_stack_ffffffffffffff20;
  BIGNUM *in_stack_ffffffffffffff28;
  BIGNUM *local_d0;
  BIGNUM *local_c0;
  BIGNUM *local_a0;
  int local_8c;
  ulong *local_78;
  ulong *local_70;
  ulong *local_68;
  int local_3c;
  int local_38;
  
  BN_CTX_start(in_R8);
  local_108 = in_RDI;
  if (in_RDI == (BIGNUM *)0x0) {
    local_108 = BN_CTX_get(in_R8);
  }
  pBVar9 = BN_CTX_get(in_R8);
  pBVar10 = BN_CTX_get(in_R8);
  a = BN_CTX_get(in_R8);
  if ((a != (BIGNUM *)0x0) && (pBVar11 = BN_copy(a,in_RCX), pBVar11 != (BIGNUM *)0x0)) {
    bn_left_align(local_f8);
    a->neg = 0;
    iVar7 = bn_lshift_fixed_top(in_stack_ffffffffffffff28,in_stack_ffffffffffffff20,
                                in_stack_ffffffffffffff1c);
    if (iVar7 != 0) {
      iVar7 = a->top;
      local_8c = pBVar10->top;
      words = (int)((ulong)in_stack_fffffffffffffee8 >> 0x20);
      if (local_8c <= iVar7) {
        pBVar12 = bn_wexpand(in_stack_fffffffffffffef0,words);
        if (pBVar12 == (BIGNUM *)0x0) goto LAB_00220d68;
        memset(pBVar10->d + local_8c,0,(long)((iVar7 - local_8c) + 1) << 3);
        local_8c = iVar7 + 1;
        pBVar10->top = local_8c;
      }
      iVar8 = local_8c - iVar7;
      local_70 = pBVar10->d + iVar8;
      local_78 = pBVar10->d + (local_8c + -1);
      pBVar12 = (BIGNUM *)a->d[iVar7 + -1];
      if (iVar7 == 1) {
        a_00 = (BIGNUM *)0x0;
      }
      else {
        a_00 = (BIGNUM *)a->d[iVar7 + -2];
      }
      pBVar14 = a_00;
      pBVar13 = bn_wexpand(a_00,words);
      if (pBVar13 != (BIGNUM *)0x0) {
        uVar1 = *(uint *)(in_RDX + 0x10);
        local_108->neg = uVar1 ^ in_RCX->neg;
        local_108->top = iVar8;
        local_108->flags = local_108->flags;
        puVar2 = local_108->d;
        pBVar14 = bn_wexpand(pBVar14,words);
        if (pBVar14 != (BIGNUM *)0x0) {
          local_38 = 0;
          local_68 = puVar2 + iVar8;
          do {
            if (iVar8 <= local_38) {
              pBVar10->neg = uVar1;
              pBVar10->top = iVar7;
              pBVar10->flags = pBVar10->flags;
              if (in_RSI != 0) {
                bn_rshift_fixed_top(in_stack_ffffffffffffff28,in_stack_ffffffffffffff20,
                                    in_stack_ffffffffffffff1c);
              }
              BN_CTX_end(in_R8);
              return 1;
            }
            if ((BIGNUM *)*local_78 == pBVar12) {
              local_a0 = (BIGNUM *)0xffffffffffffffff;
            }
            else {
              if (local_78 == local_70) {
                pBVar14 = (BIGNUM *)0x0;
              }
              else {
                pBVar14 = (BIGNUM *)local_78[-2];
              }
              auVar6._8_8_ = (BIGNUM *)*local_78;
              auVar6._0_8_ = local_78[-1];
              auVar3._8_8_ = 0;
              auVar3._0_8_ = pBVar12;
              in_stack_ffffffffffffff20 = SUB168(auVar6 / auVar3,0);
              local_c0 = SUB168(auVar6 % auVar3,0);
              auVar4._8_8_ = 0;
              auVar4._0_8_ = a_00;
              auVar5._8_8_ = 0;
              auVar5._0_8_ = in_stack_ffffffffffffff20;
              in_stack_ffffffffffffff28 = SUB168(auVar4 * auVar5,8);
              local_f8 = SUB168(auVar4 * auVar5,0);
              local_a0 = in_stack_ffffffffffffff20;
              for (local_d0 = local_f8;
                  (local_c0 <= in_stack_ffffffffffffff28 &&
                  ((in_stack_ffffffffffffff28 != local_c0 || (pBVar14 < local_d0))));
                  local_d0 = (BIGNUM *)((long)local_d0 - (long)a_00)) {
                local_a0 = (BIGNUM *)((long)&local_a0[-1].flags + 3);
                local_c0 = (BIGNUM *)((long)&local_c0->d + (long)&pBVar12->d);
                if (local_c0 < pBVar12) break;
                if (local_d0 < a_00) {
                  in_stack_ffffffffffffff28 =
                       (BIGNUM *)((long)&in_stack_ffffffffffffff28[-1].flags + 3);
                }
              }
            }
            uVar15 = bn_mul_words(pBVar9->d,a->d,iVar7,(ulong)local_a0);
            pBVar9->d[iVar7] = uVar15;
            local_70 = local_70 + -1;
            uVar15 = bn_sub_words(local_70,local_70,pBVar9->d,iVar7 + 1);
            for (local_3c = 0; local_3c < iVar7; local_3c = local_3c + 1) {
              pBVar9->d[local_3c] = a->d[local_3c] & -uVar15;
            }
            uVar16 = bn_add_words(local_70,local_70,pBVar9->d,iVar7);
            *local_78 = uVar16 + *local_78;
            local_68[-1] = (long)local_a0 - uVar15;
            local_38 = local_38 + 1;
            local_78 = local_78 + -1;
            local_68 = local_68 + -1;
          } while( true );
        }
      }
    }
  }
LAB_00220d68:
  BN_CTX_end(in_R8);
  return 0;
}

Assistant:

int bn_div_fixed_top(BIGNUM *dv, BIGNUM *rm, const BIGNUM *num,
                     const BIGNUM *divisor, BN_CTX *ctx)
{
    int norm_shift, i, j, loop;
    BIGNUM *tmp, *snum, *sdiv, *res;
    BN_ULONG *resp, *wnum, *wnumtop;
    BN_ULONG d0, d1;
    int num_n, div_n, num_neg;

    assert(divisor->top > 0 && divisor->d[divisor->top - 1] != 0);

    bn_check_top(num);
    bn_check_top(divisor);
    bn_check_top(dv);
    bn_check_top(rm);

    BN_CTX_start(ctx);
    res = (dv == NULL) ? BN_CTX_get(ctx) : dv;
    tmp = BN_CTX_get(ctx);
    snum = BN_CTX_get(ctx);
    sdiv = BN_CTX_get(ctx);
    if (sdiv == NULL)
        goto err;

    /* First we normalise the numbers */
    if (!BN_copy(sdiv, divisor))
        goto err;
    norm_shift = bn_left_align(sdiv);
    sdiv->neg = 0;
    /*
     * Note that bn_lshift_fixed_top's output is always one limb longer
     * than input, even when norm_shift is zero. This means that amount of
     * inner loop iterations is invariant of dividend value, and that one
     * doesn't need to compare dividend and divisor if they were originally
     * of the same bit length.
     */
    if (!(bn_lshift_fixed_top(snum, num, norm_shift)))
        goto err;

    div_n = sdiv->top;
    num_n = snum->top;

    if (num_n <= div_n) {
        /* caller didn't pad dividend -> no constant-time guarantee... */
        if (bn_wexpand(snum, div_n + 1) == NULL)
            goto err;
        memset(&(snum->d[num_n]), 0, (div_n - num_n + 1) * sizeof(BN_ULONG));
        snum->top = num_n = div_n + 1;
    }

    loop = num_n - div_n;
    /*
     * Lets setup a 'window' into snum This is the part that corresponds to
     * the current 'area' being divided
     */
    wnum = &(snum->d[loop]);
    wnumtop = &(snum->d[num_n - 1]);

    /* Get the top 2 words of sdiv */
    d0 = sdiv->d[div_n - 1];
    d1 = (div_n == 1) ? 0 : sdiv->d[div_n - 2];

    /* Setup quotient */
    if (!bn_wexpand(res, loop))
        goto err;
    num_neg = num->neg;
    res->neg = (num_neg ^ divisor->neg);
    res->top = loop;
    res->flags |= BN_FLG_FIXED_TOP;
    resp = &(res->d[loop]);

    /* space for temp */
    if (!bn_wexpand(tmp, (div_n + 1)))
        goto err;

    for (i = 0; i < loop; i++, wnumtop--) {
        BN_ULONG q, l0;
        /*
         * the first part of the loop uses the top two words of snum and sdiv
         * to calculate a BN_ULONG q such that | wnum - sdiv * q | < sdiv
         */
# if defined(BN_DIV3W)
        q = bn_div_3_words(wnumtop, d1, d0);
# else
        BN_ULONG n0, n1, rem = 0;

        n0 = wnumtop[0];
        n1 = wnumtop[-1];
        if (n0 == d0)
            q = BN_MASK2;
        else {                  /* n0 < d0 */
            BN_ULONG n2 = (wnumtop == wnum) ? 0 : wnumtop[-2];
#  ifdef BN_LLONG
            BN_ULLONG t2;

#   if defined(BN_LLONG) && defined(BN_DIV2W) && !defined(bn_div_words)
            q = (BN_ULONG)(((((BN_ULLONG) n0) << BN_BITS2) | n1) / d0);
#   else
            q = bn_div_words(n0, n1, d0);
#   endif

#   ifndef REMAINDER_IS_ALREADY_CALCULATED
            /*
             * rem doesn't have to be BN_ULLONG. The least we
             * know it's less that d0, isn't it?
             */
            rem = (n1 - q * d0) & BN_MASK2;
#   endif
            t2 = (BN_ULLONG) d1 *q;

            for (;;) {
                if (t2 <= ((((BN_ULLONG) rem) << BN_BITS2) | n2))
                    break;
                q--;
                rem += d0;
                if (rem < d0)
                    break;      /* don't let rem overflow */
                t2 -= d1;
            }
#  else                         /* !BN_LLONG */
            BN_ULONG t2l, t2h;

            q = bn_div_words(n0, n1, d0);
#   ifndef REMAINDER_IS_ALREADY_CALCULATED
            rem = (n1 - q * d0) & BN_MASK2;
#   endif

#   if defined(BN_UMULT_LOHI)
            BN_UMULT_LOHI(t2l, t2h, d1, q);
#   elif defined(BN_UMULT_HIGH)
            t2l = d1 * q;
            t2h = BN_UMULT_HIGH(d1, q);
#   else
            {
                BN_ULONG ql, qh;
                t2l = LBITS(d1);
                t2h = HBITS(d1);
                ql = LBITS(q);
                qh = HBITS(q);
                mul64(t2l, t2h, ql, qh); /* t2=(BN_ULLONG)d1*q; */
            }
#   endif

            for (;;) {
                if ((t2h < rem) || ((t2h == rem) && (t2l <= n2)))
                    break;
                q--;
                rem += d0;
                if (rem < d0)
                    break;      /* don't let rem overflow */
                if (t2l < d1)
                    t2h--;
                t2l -= d1;
            }
#  endif                        /* !BN_LLONG */
        }
# endif                         /* !BN_DIV3W */

        l0 = bn_mul_words(tmp->d, sdiv->d, div_n, q);
        tmp->d[div_n] = l0;
        wnum--;
        /*
         * ignore top values of the bignums just sub the two BN_ULONG arrays
         * with bn_sub_words
         */
        l0 = bn_sub_words(wnum, wnum, tmp->d, div_n + 1);
        q -= l0;
        /*
         * Note: As we have considered only the leading two BN_ULONGs in
         * the calculation of q, sdiv * q might be greater than wnum (but
         * then (q-1) * sdiv is less or equal than wnum)
         */
        for (l0 = 0 - l0, j = 0; j < div_n; j++)
            tmp->d[j] = sdiv->d[j] & l0;
        l0 = bn_add_words(wnum, wnum, tmp->d, div_n);
        (*wnumtop) += l0;
        assert((*wnumtop) == 0);

        /* store part of the result */
        *--resp = q;
    }
    /* snum holds remainder, it's as wide as divisor */
    snum->neg = num_neg;
    snum->top = div_n;
    snum->flags |= BN_FLG_FIXED_TOP;
    if (rm != NULL)
        bn_rshift_fixed_top(rm, snum, norm_shift);
    BN_CTX_end(ctx);
    return 1;
 err:
    bn_check_top(rm);
    BN_CTX_end(ctx);
    return 0;
}